

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree-inl.hh
# Opt level: O0

Node * __thiscall
phosg::KDTree<phosg::Vector2<long>,_long>::find_subtree_min_max
          (KDTree<phosg::Vector2<long>,_long> *this,Node *n,size_t target_dim,bool find_max)

{
  _Map_pointer pppNVar1;
  bool bVar2;
  reference ppNVar3;
  long lVar4;
  long lVar5;
  undefined1 local_80 [8];
  deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  pending;
  Node *ret;
  bool find_max_local;
  size_t target_dim_local;
  Node *n_local;
  KDTree<phosg::Vector2<long>,_long> *this_local;
  
  pending.
  super__Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)n;
  target_dim_local = (size_t)n;
  n_local = (Node *)this;
  ::std::
  deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ::deque((deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
           *)local_80);
  ::std::
  deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
  ::emplace_back<phosg::KDTree<phosg::Vector2<long>,long>::Node*&>
            ((deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
              *)local_80,(Node **)&target_dim_local);
  while (bVar2 = ::std::
                 deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                 ::empty((deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                          *)local_80),
        pppNVar1 = pending.
                   super__Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node, ((bVar2 ^ 0xffU) & 1) != 0) {
    ppNVar3 = ::std::
              deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
              ::front((deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                       *)local_80);
    target_dim_local = (size_t)*ppNVar3;
    ::std::
    deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
    ::pop_front((deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                 *)local_80);
    if (find_max) {
      lVar4 = Vector2<long>::at((Vector2<long> *)target_dim_local,target_dim);
      lVar5 = Vector2<long>::at((Vector2<long> *)
                                pending.
                                super__Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                                ._M_impl.super__Deque_impl_data._M_finish._M_node,target_dim);
      if (lVar5 < lVar4) {
        pending.
        super__Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)target_dim_local;
      }
    }
    else {
      lVar4 = Vector2<long>::at((Vector2<long> *)target_dim_local,target_dim);
      lVar5 = Vector2<long>::at((Vector2<long> *)
                                pending.
                                super__Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                                ._M_impl.super__Deque_impl_data._M_finish._M_node,target_dim);
      if (lVar4 < lVar5) {
        pending.
        super__Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)target_dim_local;
      }
    }
    if (((*(size_t *)(target_dim_local + 0x10) != target_dim) || (!find_max)) &&
       (*(long *)(target_dim_local + 0x18) != 0)) {
      ::std::
      deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
      ::emplace_back<phosg::KDTree<phosg::Vector2<long>,long>::Node*&>
                ((deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
                  *)local_80,(Node **)(target_dim_local + 0x18));
    }
    if (((*(size_t *)(target_dim_local + 0x10) != target_dim) || (find_max)) &&
       (*(long *)(target_dim_local + 0x20) != 0)) {
      ::std::
      deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
      ::emplace_back<phosg::KDTree<phosg::Vector2<long>,long>::Node*&>
                ((deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
                  *)local_80,(Node **)(target_dim_local + 0x20));
    }
  }
  ::std::
  deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ::~deque((deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
            *)local_80);
  return (Node *)pppNVar1;
}

Assistant:

typename KDTree<CoordType, ValueType>::Node*
KDTree<CoordType, ValueType>::find_subtree_min_max(Node* n,
    size_t target_dim, bool find_max) {

  Node* ret = n;

  std::deque<Node*> pending;
  pending.emplace_back(n);
  while (!pending.empty()) {
    n = pending.front();
    pending.pop_front();

    // update the min/max if this point is more extreme
    if (find_max) {
      if (n->pt.at(target_dim) > ret->pt.at(target_dim)) {
        ret = n;
      }
    } else {
      if (n->pt.at(target_dim) < ret->pt.at(target_dim)) {
        ret = n;
      }
    }

    // add new points to pending if needed. if this point splits the space along
    // the dimension we care about, then we only need to look at one side;
    // otherwise we have to look at both
    if (((n->dim != target_dim) || !find_max) && n->before) {
      pending.emplace_back(n->before);
    }
    if (((n->dim != target_dim) || find_max) && n->after_or_equal) {
      pending.emplace_back(n->after_or_equal);
    }
  }

  return ret;
}